

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void testing::internal::LogElementMatcherPairVec(ElementMatcherPairs *pairs,ostream *stream)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  pointer ppVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
  ppVar3 = (pairs->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (pairs->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    __s = "";
    do {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n  (",4);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"element #",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"matcher #",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      ppVar3 = ppVar3 + 1;
      __s = ",";
    } while (ppVar3 != (pairs->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n}",2);
  return;
}

Assistant:

static void LogElementMatcherPairVec(const ElementMatcherPairs& pairs,
                                     ::std::ostream* stream) {
  typedef ElementMatcherPairs::const_iterator Iter;
  ::std::ostream& os = *stream;
  os << "{";
  const char* sep = "";
  for (Iter it = pairs.begin(); it != pairs.end(); ++it) {
    os << sep << "\n  (" << "element #" << it->first << ", " << "matcher #"
       << it->second << ")";
    sep = ",";
  }
  os << "\n}";
}